

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_PackedParsing_Test::TestBody
          (ExtensionSetTest_PackedParsing_Test *this)

{
  char *in_R9;
  string_view data_00;
  AssertHelper AStack_1c8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1c0;
  string data;
  string local_198;
  AssertionResult gtest_ar_;
  TestPackedExtensions destination;
  TestPackedTypes source;
  
  proto2_unittest::TestPackedTypes::TestPackedTypes(&source);
  proto2_unittest::TestPackedExtensions::TestPackedExtensions(&destination);
  data._M_dataplus._M_p = (pointer)&data.field_2;
  data._M_string_length = 0;
  data.field_2._M_local_buf[0] = '\0';
  TestUtil::SetPackedFields<proto2_unittest::TestPackedTypes>(&source);
  MessageLite::SerializeToString((MessageLite *)&source,&data);
  data_00._M_str = data._M_dataplus._M_p;
  data_00._M_len = data._M_string_length;
  gtest_ar_.success_ = MessageLite::ParseFromString((MessageLite *)&destination,data_00);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)&gtest_ar_,
               (AssertionResult *)"destination.ParseFromString(data)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x297,local_198._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_1c8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1c8);
    std::__cxx11::string::~string((string *)&local_198);
    if (local_1c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  TestUtil::ExpectPackedExtensionsSet<proto2_unittest::TestPackedExtensions>(&destination);
  std::__cxx11::string::~string((string *)&data);
  proto2_unittest::TestPackedExtensions::~TestPackedExtensions(&destination);
  proto2_unittest::TestPackedTypes::~TestPackedTypes(&source);
  return;
}

Assistant:

TEST(ExtensionSetTest, PackedParsing) {
  // Serialize as TestPackedTypes and parse as TestPackedExtensions.
  unittest::TestPackedTypes source;
  unittest::TestPackedExtensions destination;
  std::string data;

  TestUtil::SetPackedFields(&source);
  source.SerializeToString(&data);
  EXPECT_TRUE(destination.ParseFromString(data));
  TestUtil::ExpectPackedExtensionsSet(destination);
}